

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  ImVec2 *out_b;
  long lVar1;
  ImDrawIdx *pIVar2;
  ImDrawVert *pIVar3;
  undefined1 auVar4 [8];
  undefined4 uVar5;
  uint uVar6;
  ImU32 col_upr_right;
  ImU32 IVar7;
  undefined8 extraout_RAX;
  undefined7 uVar8;
  char *text_end;
  float *pfVar9;
  byte bVar10;
  ImVec2 *pIVar11;
  uint uVar12;
  long lVar13;
  ImDrawList *this;
  bool bVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  int iVar18;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  int iVar22;
  ImVec2 p_min;
  ImVec2 pos;
  undefined4 extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  ImVec2 IVar19;
  ImVec2 pos_00;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  uint extraout_XMM0_Dd;
  undefined1 extraout_var [12];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined8 extraout_XMM0_Qb;
  float fVar23;
  ImVec2 p_max;
  ImVec2 p_max_00;
  ImVec2 half_sz;
  ImVec2 gradient_p1;
  ImVec2 half_sz_00;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float V;
  ImVec2 picker_pos;
  ImGuiContext *g;
  ImVec2 current_off_unrotated;
  ImVec2 triangle_pc;
  ImVec2 triangle_pa;
  float vv;
  float uu;
  float ww;
  float backup_initial_col [4];
  ImVec2 trc;
  ImVec2 trb;
  uint local_1f8;
  float local_1f4;
  uint local_1f0;
  float local_1ec;
  float local_1e8;
  float local_1e4;
  ImVec2 local_1e0;
  undefined1 local_1d8 [8];
  undefined8 uStack_1d0;
  ImVec2 *local_1c0;
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  ImVec2 local_190;
  ImVec4 local_188;
  ImU32 local_170;
  uint local_16c;
  ImVec2 local_168;
  ImVec2 local_160;
  float local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  ImVec2 local_138;
  ImVec2 local_130;
  undefined1 local_128 [8];
  ImVec2 local_120;
  float local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  undefined1 local_108 [16];
  ImDrawList *local_f0;
  ImVec2 local_e8;
  ImU32 local_e0;
  uint local_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  size_t local_b8;
  ImGuiWindow *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [24];
  ImVec2 local_40;
  ImVec2 local_38;
  
  uStack_1b0 = local_1b8;
  local_1b8 = (undefined1  [8])GImGui;
  local_b0 = GImGui->CurrentWindow;
  local_b0->WriteAccessed = true;
  local_f0 = local_b0->DrawList;
  pfVar9 = ref_col;
  PushID(label);
  uVar15 = (uint)pfVar9;
  BeginGroup();
  uVar12 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(col,uVar12);
  }
  auVar30 = _local_1b8;
  auVar4 = local_1b8;
  if ((flags & 0x6000000U) == 0) {
    uVar6 = *(uint *)((long)local_1b8 + 0x2d4c) & 0x6000000;
    uVar15 = 0x2000000;
    if (uVar6 != 0) {
      uVar15 = uVar6;
    }
    uVar12 = uVar12 | uVar15;
  }
  if ((uVar12 & 8) == 0) {
    uVar12 = uVar12 | *(uint *)((long)local_1b8 + 0x2d4c) & 0x10000;
  }
  local_16c = uVar12 & 0x10002;
  bVar14 = local_16c == 0x10000;
  local_1e0 = (local_b0->DC).CursorPos;
  local_1c0 = (ImVec2 *)col;
  local_118 = GetFrameHeight();
  uStack_114 = extraout_XMM0_Db;
  uStack_110 = extraout_XMM0_Dc;
  uStack_10c = extraout_XMM0_Dd;
  fVar16 = CalcItemWidth();
  pIVar11 = local_1c0;
  local_108 = ZEXT416((uint)*(float *)((long)auVar4 + 0x159c));
  fVar16 = fVar16 - (local_118 + *(float *)((long)auVar4 + 0x159c)) * (float)(byte)(bVar14 + 1);
  uVar6 = -(uint)(fVar16 <= local_118);
  uStack_154 = extraout_var._0_4_ & uStack_114;
  uStack_150 = extraout_var._4_4_ & uStack_110;
  uStack_14c = extraout_var._8_4_ & uStack_10c;
  local_158 = (float)(uVar6 & (uint)local_118 | ~uVar6 & (uint)fVar16);
  local_b8 = (ulong)((uVar12 & 2) == 0) * 4 + 0xc;
  memcpy(local_58,local_1c0,local_b8);
  local_1e8 = local_158 * 0.08;
  local_a8 = ZEXT416((uint)(local_158 * 0.5));
  local_160.x = local_158 * 0.5 - local_1e8;
  _local_c8 = ZEXT416((uint)local_160.x);
  local_190.x = (local_118 + local_158) * 0.5 + local_1e0.x;
  local_190.y = local_158 * 0.5 + local_1e0.y;
  local_1a8._0_4_ = local_1e0.x + local_158 + (float)local_108._0_4_;
  local_1a8._4_4_ = local_1e0.y;
  _fStack_1a0 = 0;
  local_1d8._4_4_ = uStack_114;
  local_1d8._0_4_ = local_118 + (float)local_1a8._0_4_;
  uStack_1d0._0_4_ = uStack_110;
  uStack_1d0._4_4_ = uStack_10c;
  local_160.x = local_160.x - (float)(int)(local_158 * 0.027);
  local_160.y = 0.0;
  local_130.x = local_160.x * -0.5;
  local_130.y = local_160.x * -0.866025;
  local_168.y = local_160.x * 0.866025;
  local_168.x = local_130.x;
  ColorConvertRGBtoHSV(pIVar11->x,pIVar11->y,pIVar11[1].x,&local_1f4,&local_1ec,&local_1e4);
  PushItemFlag(8,true);
  if ((uVar12 >> 0x1a & 1) == 0) {
    if ((uVar12 >> 0x19 & 1) == 0) {
      local_1f0 = 0;
      uVar15 = 0;
      local_1f8 = 0;
    }
    else {
      local_188.y = local_158;
      local_188.x = local_158;
      InvisibleButton("sv",(ImVec2 *)&local_188);
      bVar14 = IsItemActive();
      if (bVar14) {
        auVar21._0_4_ = local_158 + -1.0;
        auVar20._0_4_ = (float)*(undefined8 *)((long)local_1b8 + 0x130) - local_1e0.x;
        auVar20._4_4_ =
             (float)((ulong)*(undefined8 *)((long)local_1b8 + 0x130) >> 0x20) - local_1e0.y;
        auVar20._8_8_ = 0;
        auVar21._4_4_ = auVar21._0_4_;
        auVar21._8_4_ = auVar21._0_4_;
        auVar21._12_4_ = auVar21._0_4_;
        auVar21 = divps(auVar20,auVar21);
        fVar16 = auVar21._0_4_;
        fVar17 = auVar21._4_4_;
        auVar29._4_4_ = -(uint)(fVar16 < 0.0);
        auVar29._0_4_ = -(uint)(fVar17 < 0.0);
        auVar29._8_4_ = -(uint)(fVar17 < 1.0);
        auVar29._12_4_ = -(uint)(fVar16 < 1.0);
        uVar6 = movmskps(local_1b8._0_4_,auVar29);
        auVar26._4_4_ = -(uint)(0.0 < fVar16);
        auVar26._0_4_ = -(uint)(0.0 < fVar17);
        auVar26._8_4_ = -(uint)(1.0 < fVar17);
        auVar26._12_4_ = -(uint)(1.0 < fVar16);
        uVar15 = movmskps(uVar15,auVar26);
        auVar20 = ZEXT816(0x3f800000);
        if ((uVar15 & 8) == 0) {
          auVar20 = auVar21;
        }
        fVar16 = 0.0;
        local_1ec = 0.0;
        if ((uVar6 & 2) == 0) {
          local_1ec = auVar20._0_4_;
        }
        if ((uVar15 & 4) == 0) {
          fVar16 = 1.0 - fVar17;
        }
        local_1e4 = 1.0;
        if ((uVar6 & 1) == 0) {
          local_1e4 = fVar16;
        }
        local_1f0 = (uint)CONCAT71((uint7)(uint3)(uVar6 >> 8),1);
      }
      else {
        local_1f0 = 0;
      }
      if ((uVar12 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      local_188.y = local_1e0.y;
      local_188.x = (float)local_1a8._0_4_;
      SetCursorScreenPos((ImVec2 *)&local_188);
      local_188.y = local_158;
      local_188.x = local_118;
      InvisibleButton("hue",(ImVec2 *)&local_188);
      bVar14 = IsItemActive();
      if (bVar14) {
        fVar16 = (*(float *)((long)local_1b8 + 0x134) - local_1e0.y) / (local_158 + -1.0);
        local_1f4 = 1.0;
        if (fVar16 <= 1.0) {
          local_1f4 = fVar16;
        }
        local_1f4 = (float)(~-(uint)(fVar16 < 0.0) & (uint)local_1f4);
        uVar15 = (uint)CONCAT71(auVar30._1_7_,1);
        local_1f8 = 1;
      }
      else {
        uVar15 = 0;
        local_1f8 = local_1f0;
      }
    }
  }
  else {
    local_188.y = local_158;
    local_188.x = *(float *)((long)auVar4 + 0x159c) + local_158 + local_118;
    InvisibleButton("hsv",(ImVec2 *)&local_188);
    bVar14 = IsItemActive();
    if (bVar14) {
      fVar23 = *(float *)((long)auVar4 + 0x3d0) - local_190.x;
      fVar31 = *(float *)((long)auVar4 + 0x3d4) - local_190.y;
      fVar17 = *(float *)((long)auVar4 + 0x130) - local_190.x;
      local_98 = ZEXT416((uint)fVar17);
      fVar16 = *(float *)((long)auVar4 + 0x134) - local_190.y;
      local_88 = ZEXT416((uint)fVar16);
      local_78 = ZEXT416((uint)fVar31);
      local_d8 = ZEXT416((uint)fVar23);
      fVar23 = fVar23 * fVar23 + fVar31 * fVar31;
      if ((fVar23 < ((float)local_c8._0_4_ + -1.0) * ((float)local_c8._0_4_ + -1.0)) ||
         (((float)local_a8._0_4_ + 1.0) * ((float)local_a8._0_4_ + 1.0) < fVar23)) {
        uVar15 = 0;
      }
      else {
        fVar16 = atan2f(fVar16,fVar17);
        fVar16 = (fVar16 / 3.1415927) * 0.5;
        local_1f4 = (float)(~-(uint)(fVar16 < 0.0) & (uint)fVar16 |
                           (uint)(fVar16 + 1.0) & -(uint)(fVar16 < 0.0));
        uVar15 = (uint)CONCAT71(auVar30._1_7_,1);
      }
      local_148._0_4_ = cosf(local_1f4 * -2.0 * 3.1415927);
      local_148._4_4_ = extraout_XMM0_Db_00;
      fStack_140 = (float)extraout_XMM0_Dc_00;
      fStack_13c = (float)extraout_XMM0_Dd_00;
      fVar16 = sinf(local_1f4 * -2.0 * 3.1415927);
      uVar5 = local_d8._0_4_;
      local_d8._4_4_ = extraout_XMM0_Db_01;
      local_d8._0_4_ = fVar16;
      local_d8._8_4_ = extraout_XMM0_Dc_01;
      local_d8._12_4_ = extraout_XMM0_Dd_01;
      local_188.x = (float)local_148._0_4_ * (float)uVar5 + -(float)local_78._0_4_ * fVar16;
      local_188.y = fVar16 * (float)uVar5 + (float)local_148._0_4_ * (float)local_78._0_4_;
      bVar14 = ImTriangleContainsPoint(&local_160,&local_130,&local_168,(ImVec2 *)&local_188);
      if (bVar14) {
        local_188.x = (float)local_148._0_4_ * (float)local_98._0_4_ +
                      -(float)local_88._0_4_ * (float)local_d8._0_4_;
        local_188.y = (float)local_d8._0_4_ * (float)local_98._0_4_ +
                      (float)local_148._0_4_ * (float)local_88._0_4_;
        bVar14 = ImTriangleContainsPoint(&local_160,&local_130,&local_168,(ImVec2 *)&local_188);
        if (!bVar14) {
          local_188._0_8_ =
               ImTriangleClosestPoint(&local_160,&local_130,&local_168,(ImVec2 *)&local_188);
        }
        ImTriangleBarycentricCoords
                  (&local_160,&local_130,&local_168,(ImVec2 *)&local_188,(float *)local_128,
                   &local_138.x,&local_e8.x);
        fVar17 = 1.0 - local_138.x;
        fVar16 = 1.0;
        if (fVar17 <= 1.0) {
          fVar16 = fVar17;
        }
        local_1e4 = (float)(-(uint)(fVar17 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar17 < 0.0001) & (uint)fVar16);
        fVar17 = (float)local_128._0_4_ / local_1e4;
        fVar16 = 1.0;
        if (fVar17 <= 1.0) {
          fVar16 = fVar17;
        }
        local_1ec = (float)(-(uint)(fVar17 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar17 < 0.0001) & (uint)fVar16);
        uVar8 = (undefined7)((ulong)extraout_RAX >> 8);
        local_1f0 = (uint)CONCAT71(uVar8,1);
        pIVar11 = local_1c0;
        local_1f8 = (uint)CONCAT71(uVar8,1);
      }
      else {
        local_1f0 = 0;
        local_1f8 = uVar15;
      }
    }
    else {
      local_1f0 = 0;
      uVar15 = 0;
      local_1f8 = 0;
    }
    if ((uVar12 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  local_108._0_4_ = (float)local_108._0_4_ + (float)local_1d8._0_4_;
  if (local_16c == 0x10000) {
    local_188.y = local_1e0.y;
    local_188.x = (float)local_108._0_4_;
    SetCursorScreenPos((ImVec2 *)&local_188);
    local_188.y = local_158;
    local_188.x = local_118;
    InvisibleButton("alpha",(ImVec2 *)&local_188);
    bVar14 = IsItemActive();
    if (bVar14) {
      fVar17 = (*(float *)((long)local_1b8 + 0x134) - local_1e0.y) / (local_158 + -1.0);
      fVar16 = 1.0;
      if (fVar17 <= 1.0) {
        fVar16 = fVar17;
      }
      pIVar11[1].y = (float)(-(uint)(fVar17 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar17 < 0.0) & (uint)(1.0 - fVar16));
      local_1f8 = 1;
    }
  }
  PopItemFlag();
  if ((uVar12 >> 8 & 1) == 0) {
    SameLine(0.0,*(float *)((long)local_1b8 + 0x159c));
    BeginGroup();
  }
  if ((-1 < (char)uVar12) && (text_end = FindRenderedTextEnd(label,(char *)0x0), text_end != label))
  {
    if ((uVar12 >> 8 & 1) != 0) {
      SameLine(0.0,*(float *)((long)local_1b8 + 0x159c));
    }
    TextUnformatted(label,text_end);
  }
  if ((uVar12 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    local_188._0_8_ = *pIVar11;
    if ((uVar12 & 2) == 0) {
      local_188.w = pIVar11[1].y;
    }
    else {
      local_188.w = 1.0;
    }
    local_188.z = pIVar11[1].x;
    if ((char)uVar12 < '\0') {
      Text("Current");
    }
    IVar19.x = local_118 * 3.0;
    IVar19.y = local_118 * 2.0;
    fStack_140 = local_118 * 0.0;
    local_148._0_4_ = IVar19.x;
    local_148._4_4_ = IVar19.y;
    fStack_13c = local_118 * 0.0;
    ColorButton("##current",&local_188,uVar12 & 0xe0040,IVar19);
    pIVar11 = local_1c0;
    if (ref_col != (float *)0x0) {
      Text("Original");
      local_128._0_4_ = ref_col[0];
      local_128._4_4_ = ref_col[1];
      if ((uVar12 & 2) == 0) {
        local_120.y = ref_col[3];
      }
      else {
        local_120.y = 1.0;
      }
      local_120.x = ref_col[2];
      bVar14 = ColorButton("##original",(ImVec4 *)local_128,uVar12 & 0xe0040,(ImVec2)local_148);
      pIVar11 = local_1c0;
      if (bVar14) {
        memcpy(local_1c0,ref_col,local_b8);
        local_1f8 = 1;
      }
    }
    PopItemFlag();
    EndGroup();
  }
  pfVar9 = &pIVar11->y;
  out_b = pIVar11 + 1;
  if (((char)uVar15 != '\0') ||
     (fVar16 = local_118 * 0.2, fVar17 = 0.0, fVar23 = 0.0, fVar31 = 0.0, (char)local_1f0 != '\0'))
  {
    _local_148 = ZEXT416((uint)(local_118 * 0.2));
    ColorConvertHSVtoRGB
              ((float)(~-(uint)(1.0 <= local_1f4) & (uint)local_1f4 |
                      (uint)(local_1f4 + -1e-05) & -(uint)(1.0 <= local_1f4)),
               (float)(~-(uint)(0.0 < local_1ec) & 0x3727c5ac |
                      (uint)local_1ec & -(uint)(0.0 < local_1ec)),
               (float)(~-(uint)(0.0 < local_1e4) & 0x358637bd |
                      (uint)local_1e4 & -(uint)(0.0 < local_1e4)),&pIVar11->x,pfVar9,&out_b->x);
    fVar16 = (float)local_148._0_4_;
    fVar17 = (float)local_148._4_4_;
    fVar23 = fStack_140;
    fVar31 = fStack_13c;
  }
  iVar18 = (int)fVar16;
  iVar22 = (int)fVar17;
  fVar16 = (float)(int)fVar23;
  fVar17 = (float)(int)fVar31;
  if ((uVar12 & 0x20) == 0) {
    local_148._4_4_ = iVar22;
    local_148._0_4_ = iVar18;
    fStack_140 = fVar16;
    fStack_13c = fVar17;
    fVar16 = (float)local_108._0_4_;
    if (local_16c != 0x10000) {
      fVar16 = (float)local_1a8._0_4_;
    }
    PushItemWidth((fVar16 + local_118) - local_1e0.x);
    uVar6 = uVar12 & 0x18e001a;
    if (((uVar12 >> 0x14 & 1) == 0 && (uVar12 & 0x600000) != 0) ||
       (bVar14 = ColorEdit4("##rgb",&local_1c0->x,uVar6 | 0x100004), !bVar14)) {
LAB_0014d2f3:
      bVar10 = 0;
    }
    else {
      local_1f8 = 1;
      if (*(int *)((long)local_1b8 + 0x1a24) == 0) goto LAB_0014d2f3;
      bVar10 = *(byte *)((long)local_1b8 + 0x1a35) ^ 1;
    }
    if ((uVar12 >> 0x15 & 1) != 0 || (uVar12 & 0x500000) == 0) {
      bVar14 = ColorEdit4("##hsv",&local_1c0->x,uVar6 | 0x200004);
      local_1f8 = (uint)(byte)((byte)local_1f8 | bVar14);
    }
    if ((uVar12 >> 0x16 & 1) != 0 || (uVar12 & 0x300000) == 0) {
      bVar14 = ColorEdit4("##hex",&local_1c0->x,uVar6 | 0x400004);
      local_1f8 = (uint)(byte)((byte)local_1f8 | bVar14);
    }
    PopItemWidth();
    pIVar11 = local_1c0;
    iVar18 = local_148._0_4_;
    iVar22 = local_148._4_4_;
    fVar16 = fStack_140;
    fVar17 = fStack_13c;
  }
  else {
    bVar10 = 0;
  }
  local_68 = (float)iVar18;
  fStack_64 = (float)iVar22;
  fStack_60 = (float)(int)fVar16;
  fStack_5c = (float)(int)fVar17;
  if (bVar10 == 0) goto LAB_0014d422;
  ColorConvertRGBtoHSV
            (pIVar11->x,pIVar11->y,pIVar11[1].x,&local_188.x,(float *)local_128,&local_138.x);
  if ((0.0 < local_188.x) || (local_1f4 <= 0.0)) goto LAB_0014d422;
  if (0.0 < local_138.x) {
LAB_0014d3fc:
    if (0.0 < (float)local_128._0_4_) goto LAB_0014d422;
    fVar16 = local_1ec * 0.5;
  }
  else {
    if ((local_1e4 == local_138.x) && (!NAN(local_1e4) && !NAN(local_138.x))) goto LAB_0014d3fc;
    local_138.x = local_1e4 * 0.5;
    fVar16 = local_1ec;
  }
  ColorConvertHSVtoRGB(local_1f4,fVar16,local_138.x,&pIVar11->x,pfVar9,&out_b->x);
LAB_0014d422:
  local_188.x = 1.0;
  local_188.y = 1.0;
  local_188.z = 1.0;
  local_188.w = 1.0;
  ColorConvertHSVtoRGB
            (local_1f4,1.0,1.0,&local_188.x,(float *)((long)&local_188 + 4),
             (float *)((long)&local_188 + 8));
  col_upr_right = ColorConvertFloat4ToU32(&local_188);
  local_128 = *(undefined1 (*) [8])pIVar11;
  local_120.y = 1.0;
  local_120.x = pIVar11[1].x;
  IVar7 = ColorConvertFloat4ToU32((ImVec4 *)local_128);
  this = local_f0;
  local_138.x = 0.0;
  local_138.y = 0.0;
  if ((uVar12 >> 0x1a & 1) == 0) {
    if ((uVar12 >> 0x19 & 1) != 0) {
      local_1b8._4_4_ = local_158;
      local_1b8._0_4_ = local_158;
      uStack_1b0._0_4_ = local_158;
      uStack_1b0._4_4_ = local_158;
      local_128._0_4_ = local_1e0.x + local_158;
      local_128._4_4_ = local_1e0.y + local_158;
      local_170 = IVar7;
      ImDrawList::AddRectFilledMultiColor
                (local_f0,&local_1e0,(ImVec2 *)local_128,0xffffffff,col_upr_right,col_upr_right,
                 0xffffffff);
      local_128._0_4_ = local_1e0.x + (float)local_1b8._0_4_;
      local_128._4_4_ = local_1e0.y + (float)local_1b8._4_4_;
      ImDrawList::AddRectFilledMultiColor
                (this,&local_1e0,(ImVec2 *)local_128,0,0,0xff000000,0xff000000);
      p_max.x = (float)local_1b8._0_4_ + local_1e0.x;
      p_max.y = (float)local_1b8._4_4_ + local_1e0.y;
      RenderFrameBorder(local_1e0,p_max,0.0);
      auVar27._4_4_ = 1.0 - local_1e4;
      auVar27._0_4_ = local_1ec;
      auVar27._8_8_ = 0;
      auVar30 = minps(_DAT_00192a80,auVar27);
      fVar16 = local_1e0.x;
      fVar17 = local_1e0.y;
      auVar28._0_4_ = (float)local_1b8._0_4_ + fVar16 + -2.0;
      auVar28._4_4_ = (float)local_1b8._4_4_ + fVar17 + -2.0;
      auVar28._8_4_ = (float)uStack_1b0 + 0.0 + 0.0;
      auVar28._12_4_ = uStack_1b0._4_4_ + 0.0 + 0.0;
      auVar24._0_4_ =
           (float)(int)((float)(-(uint)(0.0 <= local_1ec) & auVar30._0_4_) * (float)local_1b8._0_4_
                        + fVar16 + 0.5);
      auVar24._4_4_ =
           (float)(int)((float)(-(uint)(0.0 <= 1.0 - local_1e4) & auVar30._4_4_) *
                        (float)local_1b8._4_4_ + fVar17 + 0.5);
      auVar24._8_4_ = (float)(int)(auVar30._8_4_ * (float)uStack_1b0 + 0.0 + 0.0);
      auVar24._12_4_ = (float)(int)(auVar30._12_4_ * uStack_1b0._4_4_ + 0.0 + 0.0);
      auVar30 = minps(auVar28,auVar24);
      uVar15 = -(uint)(auVar24._0_4_ < fVar16 + 2.0);
      uVar12 = -(uint)(auVar24._4_4_ < fVar17 + 2.0);
      local_138 = (ImVec2)(CONCAT44(~uVar12 & auVar30._4_4_,~uVar15 & auVar30._0_4_) |
                          CONCAT44((uint)(fVar17 + 2.0) & uVar12,(uint)(fVar16 + 2.0) & uVar15));
      local_1b8._4_4_ = uStack_154;
      local_1b8._0_4_ = local_158 / 6.0;
      uStack_1b0._0_4_ = (float)uStack_150;
      uStack_1b0._4_4_ = (float)uStack_14c;
      lVar13 = 0;
      do {
        lVar1 = lVar13 + 1;
        local_128._4_4_ = (float)(int)lVar13 * (float)local_1b8._0_4_ + local_1e0.y;
        local_128._0_4_ = local_1a8._0_4_;
        local_e8.y = (float)(int)lVar1 * (float)local_1b8._0_4_ + local_1e0.y;
        local_e8.x = (float)local_1d8._0_4_;
        ImDrawList::AddRectFilledMultiColor
                  (this,(ImVec2 *)local_128,&local_e8,(&DAT_0019a6a0)[lVar13],
                   (&DAT_0019a6a0)[lVar13],(&DAT_0019a6a4)[lVar13],(&DAT_0019a6a4)[lVar13]);
        lVar13 = lVar1;
      } while (lVar1 != 6);
      _local_1b8 = ZEXT416((uint)(float)(int)(local_1f4 * local_158 + local_1e0.y + 0.5));
      p_min.y = local_1e0.y;
      p_min.x = (float)local_1a8._0_4_;
      p_max_00.y = local_158 + local_1e0.y;
      p_max_00.x = (float)local_1d8._0_4_;
      RenderFrameBorder(p_min,p_max_00,0.0);
      pos.x = (float)local_1a8._0_4_ + -1.0;
      pos.y = (float)local_1b8._0_4_;
      half_sz.x = local_68 + 1.0;
      half_sz.y = local_68;
      RenderArrowsForVerticalBar(this,pos,half_sz,local_118 + 2.0);
      IVar7 = local_170;
    }
  }
  else {
    iVar18 = 4;
    if (4 < (int)(float)local_a8._0_4_ / 0xc) {
      iVar18 = (int)(float)local_a8._0_4_ / 0xc;
    }
    local_78._0_4_ = iVar18;
    local_d8 = ZEXT416((uint)(1.5 / (float)local_a8._0_4_));
    local_88._4_4_ = 0x80000000;
    local_88._0_4_ = -(1.5 / (float)local_a8._0_4_);
    local_88._8_4_ = 0x80000000;
    local_88._12_4_ = 0x80000000;
    local_a8._0_4_ = (float)local_a8._0_4_ + (float)local_c8._0_4_;
    local_98._0_4_ = (float)local_a8._0_4_ * 0.5;
    local_c8._4_4_ = local_c8._0_4_;
    fStack_c0 = (float)local_c8._0_4_;
    fStack_bc = (float)local_c8._0_4_;
    lVar13 = 0;
    local_170 = IVar7;
    local_e0 = col_upr_right;
    local_dc = uVar15;
    do {
      fVar16 = (float)(int)lVar13 / 6.0;
      fVar16 = (fVar16 + fVar16) * 3.1415927 + (float)local_88._0_4_;
      fVar17 = ((float)(int)lVar13 + 1.0) / 6.0;
      fVar17 = (fVar17 + fVar17) * 3.1415927 + (float)local_d8._0_4_;
      local_1b8._0_4_ = fVar17;
      iVar18 = (this->VtxBuffer).Size;
      local_148._0_4_ = fVar16;
      ImDrawList::PathArcTo(this,&local_190,(float)local_98._0_4_,fVar16,fVar17,local_78._0_4_);
      ImDrawList::AddPolyline(this,(this->_Path).Data,(this->_Path).Size,0xffffffff,false,local_1e8)
      ;
      (this->_Path).Size = 0;
      iVar22 = (this->VtxBuffer).Size;
      _local_1a8 = ZEXT416((uint)local_190.x);
      local_1d8._0_4_ = cosf((float)local_148._0_4_);
      local_1d8._4_4_ = extraout_XMM0_Db_02;
      uStack_1d0._0_4_ = extraout_XMM0_Dc_02;
      uStack_1d0._4_4_ = extraout_XMM0_Dd_02;
      auVar30._4_4_ = local_190.y;
      auVar30._0_4_ = local_1a8._0_4_;
      auVar30._8_4_ = local_1a8._4_4_;
      auVar30._12_4_ = 0;
      _local_1a8 = auVar30;
      fVar16 = sinf((float)local_148._0_4_);
      fVar17 = (float)local_1d8._4_4_ * fStack_c0;
      local_1d8._4_4_ = fVar16 * (float)local_c8._4_4_ + (float)local_1a8._4_4_;
      local_1d8._0_4_ = (float)local_1d8._0_4_ * (float)local_c8._0_4_ + (float)local_1a8._0_4_;
      uStack_1d0._0_4_ = (uint)(fVar17 + fStack_1a0);
      uStack_1d0._4_4_ = (uint)(extraout_XMM0_Db_03 * fStack_bc + fStack_19c);
      _local_1a8 = ZEXT416((uint)local_190.x);
      local_148._0_4_ = cosf((float)local_1b8._0_4_);
      local_148._4_4_ = extraout_XMM0_Db_04;
      fStack_140 = (float)extraout_XMM0_Dc_03;
      fStack_13c = (float)extraout_XMM0_Dd_03;
      auVar25._4_4_ = local_190.y;
      auVar25._0_4_ = local_1a8._0_4_;
      auVar25._8_4_ = local_1a8._4_4_;
      auVar25._12_4_ = 0;
      _local_1a8 = auVar25;
      fVar16 = sinf((float)local_1b8._0_4_);
      gradient_p1.x = (float)local_148._0_4_ * (float)local_c8._0_4_ + (float)local_1a8._0_4_;
      gradient_p1.y = fVar16 * (float)local_c8._4_4_ + (float)local_1a8._4_4_;
      lVar1 = lVar13 + 1;
      ShadeVertsLinearColorGradientKeepAlpha
                (this,iVar18,iVar22,(ImVec2)local_1d8,gradient_p1,(&DAT_0019a6a0)[lVar13],
                 (&DAT_0019a6a4)[lVar13]);
      lVar13 = lVar1;
    } while (lVar1 != 6);
    local_1d8._0_4_ = cosf((local_1f4 + local_1f4) * 3.1415927);
    local_1d8._4_4_ = extraout_XMM0_Db_05;
    uStack_1d0._0_4_ = extraout_XMM0_Dc_04;
    uStack_1d0._4_4_ = extraout_XMM0_Dd_04;
    local_1a8._0_4_ = sinf((local_1f4 + local_1f4) * 3.1415927);
    IVar7 = local_e0;
    this = local_f0;
    local_1a8._4_4_ = extraout_XMM0_Db_06;
    fStack_1a0 = (float)extraout_XMM0_Dc_05;
    fStack_19c = (float)extraout_XMM0_Dd_05;
    local_128._0_4_ = (float)local_1d8._0_4_ * (float)local_a8._0_4_ * 0.5 + local_190.x;
    local_128._4_4_ = (float)local_1a8._0_4_ * (float)local_a8._0_4_ * 0.5 + local_190.y;
    if ((char)local_dc == '\0') {
      fVar16 = 0.55;
    }
    else {
      fVar16 = 0.65;
    }
    local_1e8 = local_1e8 * fVar16;
    iVar18 = 0x20;
    if ((int)(local_1e8 / 1.4) < 0x20) {
      iVar18 = (int)(local_1e8 / 1.4);
    }
    iVar22 = 9;
    if (9 < iVar18) {
      iVar22 = iVar18;
    }
    ImDrawList::AddCircleFilled(local_f0,(ImVec2 *)local_128,local_1e8,local_e0,iVar22);
    ImDrawList::AddCircle(this,(ImVec2 *)local_128,local_1e8 + 1.0,0xff808080,iVar22,1.0);
    ImDrawList::AddCircle(this,(ImVec2 *)local_128,local_1e8,0xffffffff,iVar22,1.0);
    local_e8.x = local_160.x * (float)local_1d8._0_4_ + -local_160.y * (float)local_1a8._0_4_ +
                 local_190.x;
    local_e8.y = local_160.x * (float)local_1a8._0_4_ + local_160.y * (float)local_1d8._0_4_ +
                 local_190.y;
    local_38.x = local_130.x * (float)local_1d8._0_4_ + -local_130.y * (float)local_1a8._0_4_ +
                 local_190.x;
    local_38.y = local_130.x * (float)local_1a8._0_4_ + local_130.y * (float)local_1d8._0_4_ +
                 local_190.y;
    local_40.x = local_168.x * (float)local_1d8._0_4_ + -local_168.y * (float)local_1a8._0_4_ +
                 local_190.x;
    local_40.y = local_168.x * (float)local_1a8._0_4_ + local_168.y * (float)local_1d8._0_4_ +
                 local_190.y;
    IVar19 = GetFontTexUvWhitePixel();
    uStack_1d0 = extraout_XMM0_Qb;
    local_1d8._0_4_ = IVar19.x;
    local_1d8._4_4_ = IVar19.y;
    ImDrawList::PrimReserve(this,6,6);
    auVar30 = _local_1d8;
    pIVar2 = this->_IdxWritePtr;
    *pIVar2 = (ImDrawIdx)this->_VtxCurrentIdx;
    this->_IdxWritePtr = pIVar2 + 1;
    this->_VtxWritePtr->pos = local_e8;
    pIVar3 = this->_VtxWritePtr;
    (pIVar3->uv).x = (float)local_1d8._0_4_;
    (pIVar3->uv).y = (float)local_1d8._4_4_;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = IVar7;
    this->_VtxWritePtr = pIVar3 + 1;
    uVar15 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar15;
    pIVar2 = this->_IdxWritePtr;
    *pIVar2 = (ImDrawIdx)uVar15;
    this->_IdxWritePtr = pIVar2 + 1;
    pIVar3[1].pos = local_38;
    pIVar3 = this->_VtxWritePtr;
    (pIVar3->uv).x = (float)local_1d8._0_4_;
    (pIVar3->uv).y = (float)local_1d8._4_4_;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = IVar7;
    this->_VtxWritePtr = pIVar3 + 1;
    uVar15 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar15;
    pIVar2 = this->_IdxWritePtr;
    *pIVar2 = (ImDrawIdx)uVar15;
    this->_IdxWritePtr = pIVar2 + 1;
    pIVar3[1].pos = local_40;
    pIVar3 = this->_VtxWritePtr;
    (pIVar3->uv).x = (float)local_1d8._0_4_;
    (pIVar3->uv).y = (float)local_1d8._4_4_;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = 0xffffffff;
    this->_VtxWritePtr = pIVar3 + 1;
    uVar15 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar15;
    pIVar2 = this->_IdxWritePtr;
    *pIVar2 = (ImDrawIdx)uVar15;
    this->_IdxWritePtr = pIVar2 + 1;
    pIVar3[1].pos = local_e8;
    pIVar3 = this->_VtxWritePtr;
    (pIVar3->uv).x = (float)local_1d8._0_4_;
    (pIVar3->uv).y = (float)local_1d8._4_4_;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = 0;
    this->_VtxWritePtr = pIVar3 + 1;
    uVar15 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar15;
    pIVar2 = this->_IdxWritePtr;
    *pIVar2 = (ImDrawIdx)uVar15;
    this->_IdxWritePtr = pIVar2 + 1;
    pIVar3[1].pos = local_38;
    pIVar3 = this->_VtxWritePtr;
    (pIVar3->uv).x = (float)local_1d8._0_4_;
    (pIVar3->uv).y = (float)local_1d8._4_4_;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = 0xff000000;
    this->_VtxWritePtr = pIVar3 + 1;
    uVar15 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar15;
    pIVar2 = this->_IdxWritePtr;
    *pIVar2 = (ImDrawIdx)uVar15;
    this->_IdxWritePtr = pIVar2 + 1;
    pIVar3[1].pos = local_40;
    pIVar3 = this->_VtxWritePtr;
    (pIVar3->uv).x = (float)local_1d8._0_4_;
    (pIVar3->uv).y = (float)local_1d8._4_4_;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = 0;
    this->_VtxWritePtr = pIVar3 + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
    _local_1d8 = auVar30;
    ImDrawList::AddTriangle(this,&local_e8,&local_38,&local_40,0xff808080,1.5);
    fVar16 = 1.0;
    if (local_1ec <= 1.0) {
      fVar16 = local_1ec;
    }
    fVar16 = (float)(~-(uint)(local_1ec < 0.0) & (uint)fVar16);
    fVar23 = 1.0 - local_1e4;
    fVar17 = 1.0;
    if (fVar23 <= 1.0) {
      fVar17 = fVar23;
    }
    fVar17 = (float)(~-(uint)(fVar23 < 0.0) & (uint)fVar17);
    fVar23 = fVar16 * (local_e8.x - local_40.x) + local_40.x;
    fVar16 = fVar16 * (local_e8.y - local_40.y) + local_40.y;
    local_138.x = fVar17 * (local_38.x - fVar23) + fVar23;
    local_138.y = fVar17 * (local_38.y - fVar16) + fVar16;
    IVar7 = local_170;
  }
  pIVar11 = local_1c0;
  if ((char)local_1f0 == '\0') {
    fVar16 = 6.0;
  }
  else {
    fVar16 = 10.0;
  }
  local_1d8._0_4_ = fVar16;
  ImDrawList::AddCircleFilled(this,&local_138,fVar16,IVar7,0xc);
  ImDrawList::AddCircle(this,&local_138,(float)local_1d8._0_4_ + 1.0,0xff808080,0xc,1.0);
  ImDrawList::AddCircle(this,&local_138,(float)local_1d8._0_4_,0xffffffff,0xc,1.0);
  if (local_16c == 0x10000) {
    fVar16 = pIVar11[1].y;
    _local_1a8 = ZEXT416((uint)fVar16);
    fVar17 = 1.0;
    if (fVar16 <= 1.0) {
      fVar17 = fVar16;
    }
    _local_1d8 = ZEXT416((uint)(1.0 - fVar17));
    local_128._4_4_ = local_1e0.y;
    local_128._0_4_ = local_108._0_4_;
    local_120.x = (float)local_108._0_4_ + local_118;
    local_120.y = local_1e0.y + local_158;
    RenderColorRectWithAlphaCheckerboard
              ((ImVec2)local_128,local_120,0,(local_120.x - (float)local_108._0_4_) * 0.5,
               (ImVec2)0x0,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              (this,(ImVec2 *)local_128,&local_120,IVar7,IVar7,IVar7 & 0xffffff,IVar7 & 0xffffff);
    local_1d8._4_4_ = (float)(int)(float)(~local_1a8._4_4_ & local_1d8._4_4_);
    local_1d8._0_4_ =
         (float)(int)((float)(-(uint)((float)local_1a8._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_1a8._0_4_ < 0.0) & local_1d8._0_4_) * local_158 +
                      local_1e0.y + 0.5);
    uStack_1d0._0_4_ = (uint)(float)(int)(float)(~(uint)fStack_1a0 & (uint)uStack_1d0);
    uStack_1d0._4_4_ = (uint)(float)(int)(float)(~(uint)fStack_19c & uStack_1d0._4_4_);
    RenderFrameBorder((ImVec2)local_128,local_120,0.0);
    pos_00.x = (float)local_108._0_4_ + -1.0;
    pos_00.y = (float)local_1d8._0_4_;
    half_sz_00.x = local_68 + 1.0;
    half_sz_00.y = local_68;
    RenderArrowsForVerticalBar(this,pos_00,half_sz_00,local_118 + 2.0);
  }
  EndGroup();
  if ((char)local_1f8 != '\0') {
    iVar18 = bcmp(local_58,pIVar11,local_b8);
    local_1f8 = local_1f8 & 0xff;
    if (iVar18 == 0) {
      local_1f8 = 0;
    }
  }
  if ((local_1f8 & 1) != 0) {
    MarkItemEdited((local_b0->DC).LastItemId);
  }
  PopID();
  return (bool)((byte)local_1f8 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImDrawList* draw_list = window->DrawList;

    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    IM_ASSERT(ImIsPowerOfTwo((int)(flags & ImGuiColorEditFlags__PickerMask))); // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, CalcItemWidth() - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = (float)(int)(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size*0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H,S,V;
    ColorConvertRGBtoHSV(col[0], col[1], col[2], H, S, V);

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner-1)*(wheel_r_inner-1) && initial_dist2 <= (wheel_r_outer+1)*(wheel_r_outer+1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI*0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size-1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextUnformatted(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");
        ColorButton("##current", col_v4, (flags & (ImGuiColorEditFlags_HDR|ImGuiColorEditFlags_AlphaPreview|ImGuiColorEditFlags_AlphaPreviewHalf|ImGuiColorEditFlags_NoTooltip)), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & (ImGuiColorEditFlags_HDR|ImGuiColorEditFlags_AlphaPreview|ImGuiColorEditFlags_AlphaPreviewHalf|ImGuiColorEditFlags_NoTooltip)), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
        ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10*1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_RGB || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_RGB))
            {
                // FIXME: Hackily differenciating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_HSV || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_HSV);
        if (flags & ImGuiColorEditFlags_HEX || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_HEX);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap)
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    ImVec4 hue_color_f(1, 1, 1, 1); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 col32_no_alpha = ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 1.0f));

    const ImU32 hue_colors[6+1] = { IM_COL32(255,0,0,255), IM_COL32(255,255,0,255), IM_COL32(0,255,0,255), IM_COL32(0,255,255,255), IM_COL32(0,0,255,255), IM_COL32(255,0,255,255), IM_COL32(255,0,0,255) };
    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 1.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(IM_COL32_WHITE, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, hue_colors[n], hue_colors[n+1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad+1, IM_COL32(128,128,128,255), hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, IM_COL32_WHITE, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_WHITE);
        draw_list->PrimVtx(tra, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->PrimVtx(trb, uv_white, IM_COL32_BLACK);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->AddTriangle(tra, trb, trc, IM_COL32(128,128,128,255), 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_WHITE, hue_color32, hue_color32, IM_COL32_WHITE);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_BLACK_TRANS, IM_COL32_BLACK_TRANS, IM_COL32_BLACK, IM_COL32_BLACK);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp((float)(int)(picker_pos.x + ImSaturate(S)     * sv_picker_size + 0.5f), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp((float)(int)(picker_pos.y + ImSaturate(1 - V) * sv_picker_size + 0.5f), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), hue_colors[i], hue_colors[i], hue_colors[i + 1], hue_colors[i + 1]);
        float bar0_line_y = (float)(int)(picker_pos.y + H * sv_picker_size + 0.5f);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, col32_no_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad+1, IM_COL32(128,128,128,255), 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, IM_COL32_WHITE, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(bar1_bb.Min, bar1_bb.Max, IM_COL32(0,0,0,0), bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, col32_no_alpha, col32_no_alpha, col32_no_alpha & ~IM_COL32_A_MASK, col32_no_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = (float)(int)(picker_pos.y + (1.0f - alpha) * sv_picker_size + 0.5f);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    PopID();

    return value_changed;
}